

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_read_scatter_single(char *prefix,kvtree *data)

{
  kvtree_elem_struct *pkVar1;
  int iVar2;
  uint uVar3;
  char *__name;
  DIR *__dirp;
  dirent *pdVar4;
  kvtree *hash2;
  long lVar5;
  byte bVar6;
  kvtree *final_tree;
  kvtree *subfile_tree;
  unsigned_long level;
  char *prefix_file_copy;
  char *prefix_dir_copy;
  unsigned_long expected_ranks;
  regex_t regex;
  char tmp [4096];
  char pattern [4096];
  kvtree *local_20b0;
  kvtree *local_20a8;
  kvtree *local_20a0;
  unsigned_long local_2098;
  char *local_2090;
  char *local_2088;
  kvtree *local_2080;
  regex_t local_2078;
  char local_2038 [4095];
  undefined1 local_1039;
  char local_1038 [4095];
  undefined1 local_39;
  
  local_20b0 = (kvtree *)
               kvtree_malloc(8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                             ,0x47);
  local_20b0->lh_first = (kvtree_elem_struct *)0x0;
  iVar2 = kvtree_read_file(prefix,local_20b0);
  if (iVar2 == 0) {
    uVar3 = kvtree_util_get_unsigned_long(local_20b0,"RANKS",(unsigned_long *)&local_2080);
    kvtree_delete(&local_20b0);
    if (uVar3 == 0) {
      local_20b0 = (kvtree *)
                   kvtree_malloc(8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                 ,0x47);
      local_20b0->lh_first = (kvtree_elem_struct *)0x0;
      local_2088 = strdup(prefix);
      __name = dirname(local_2088);
      local_2090 = strdup(prefix);
      __xpg_basename(local_2090);
      snprintf(local_1038,0x1000,"^%s\\.0\\.[0-9]+$");
      local_39 = 0;
      iVar2 = regcomp(&local_2078,local_1038,1);
      bVar6 = 1;
      if ((iVar2 == 0) && (__dirp = opendir(__name), __dirp != (DIR *)0x0)) {
        pdVar4 = readdir(__dirp);
        if (pdVar4 == (dirent *)0x0) {
          local_20a8 = (kvtree *)0x0;
        }
        else {
          local_20a8 = (kvtree *)0x0;
          do {
            iVar2 = regexec(&local_2078,pdVar4->d_name,0,(regmatch_t *)0x0,0);
            if (iVar2 == 0) {
              memset(local_2038,0,0x1000);
              snprintf(local_2038,0x1000,"%s/%s");
              local_1039 = 0;
              local_20a0 = (kvtree *)
                           kvtree_malloc(8,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                         ,0x47);
              local_20a0->lh_first = (kvtree_elem_struct *)0x0;
              iVar2 = kvtree_read_file(local_2038,local_20a0);
              if ((((iVar2 == 0) &&
                   (iVar2 = kvtree_util_get_unsigned_long(local_20a0,"LEVEL",&local_2098),
                   iVar2 == 0)) && (local_2098 == 0)) &&
                 ((hash2 = kvtree_extract(local_20a0,"RANK"), hash2 != (kvtree *)0x0 &&
                  (iVar2 = kvtree_merge(local_20b0,hash2), iVar2 == 0)))) {
                lVar5 = 0;
                for (pkVar1 = hash2->lh_first; pkVar1 != (kvtree_elem_struct *)0x0;
                    pkVar1 = (pkVar1->pointers).le_next) {
                  lVar5 = lVar5 + 1;
                }
                local_20a8 = (kvtree *)((long)&local_20a8->lh_first + lVar5);
              }
              kvtree_delete(&local_20a0);
            }
            pdVar4 = readdir(__dirp);
          } while (pdVar4 != (dirent *)0x0);
        }
        closedir(__dirp);
        kvtree_merge(data,local_20b0);
        bVar6 = 0;
        data = local_20a8;
      }
      kvtree_free(&local_2088);
      kvtree_free(&local_2090);
      kvtree_delete(&local_20b0);
      uVar3 = (uint)(data != local_2080 | bVar6);
    }
    else {
      kvtree_err("Couldn\'t get RANKS for %s\n",prefix);
    }
  }
  else {
    kvtree_delete(&local_20b0);
    kvtree_err("Couldn\'t read in high level kvtree file %s\n",prefix);
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int kvtree_read_scatter_single(const char* prefix, kvtree* data)
{
  /*
   * Read in high level kvtree.
   */
  kvtree* final_tree = kvtree_new();
  int rc = kvtree_read_file(prefix, final_tree);
  if (rc != KVTREE_SUCCESS) {
    kvtree_delete(&final_tree);
    kvtree_err("Couldn't read in high level kvtree file %s\n", prefix);
    return rc;
  }

  unsigned long expected_ranks;
  rc = kvtree_util_get_unsigned_long(final_tree, "RANKS", &expected_ranks);
  if (rc != KVTREE_SUCCESS) {
    kvtree_delete(&final_tree);
    kvtree_err("Couldn't get RANKS for %s\n", prefix);
    return rc;
  }
  kvtree_delete(&final_tree);

  /* Start construction of the final tree that we will return */
  final_tree = kvtree_new();

  /* Look at all the subfiles with our prefix and read in the file lists */
  char* prefix_dir_copy = strdup(prefix);
  char* prefix_dir = dirname(prefix_dir_copy);
  char* prefix_file_copy = strdup(prefix);
  char* prefix_file = basename(prefix_file_copy);

  /* Create our regex to match our prefix files */
  char pattern[PATH_MAX];
  snprintf(pattern, sizeof(pattern), "^%s\\.0\\.[0-9]+$", prefix_file);
  pattern[sizeof(pattern) - 1] = '\0';

  regex_t regex;
  rc = regcomp(&regex, pattern, REG_EXTENDED);
  if (rc) {
    rc = KVTREE_FAILURE;
    goto end;
  }

  DIR* d = opendir(prefix_dir);
  if (!d) {
    rc = KVTREE_FAILURE;
    goto end;
  }

  /* For each file/dir in our prefix dir */
  unsigned long actual_ranks = 0;
  struct dirent* dir;
  while ((dir = readdir(d)) != NULL) {
    /*
     * Search for any file starting with "prefix_file."
     * like "rank2file.".
     */
    /* Is this one of our subfiles?  It should have .0.x in the extension */
    rc = regexec(&regex, dir->d_name, 0, NULL, 0);
    if (rc == 0) {  /* Did we get both numbers in the extension? */
      /* subfile matches */

      /* Construct the full path to the subfile kvtree */
      char tmp[PATH_MAX];
      memset(tmp, 0, sizeof(tmp));
      snprintf(tmp, sizeof(tmp), "%s/%s", prefix_dir, dir->d_name);
      tmp[sizeof(tmp) - 1] = '\0';

      /* Read in the subfile */
      kvtree* subfile_tree = kvtree_new();
      rc = kvtree_read_file(tmp, subfile_tree);
      if (rc == KVTREE_SUCCESS) {
        /* Sanity: each subfile we want will have LEVEL=0 */
        unsigned long level;
        rc = kvtree_util_get_unsigned_long(subfile_tree, "LEVEL", &level);
        if (rc == KVTREE_SUCCESS && level == 0) {
          /* Break off and remove the "RANK" subtree from the rank2file tree */
          kvtree* subfile_rank_tree = kvtree_extract(subfile_tree, "RANK");
          if (subfile_rank_tree) {
            if (kvtree_merge(final_tree, subfile_rank_tree) == KVTREE_SUCCESS) {
              actual_ranks += kvtree_size(subfile_rank_tree);
            }
          }
        }
      }
      kvtree_delete(&subfile_tree);
    }
  }
  closedir(d);
  kvtree_merge(data, final_tree);
  rc = KVTREE_SUCCESS;

end:
  kvtree_free(&prefix_dir_copy);
  kvtree_free(&prefix_file_copy);
  kvtree_delete(&final_tree);
  if (rc != KVTREE_SUCCESS || actual_ranks != expected_ranks) {
    return KVTREE_FAILURE;
  }

  return KVTREE_SUCCESS;
}